

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  Geometry *this;
  undefined1 (*pauVar5) [16];
  byte bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  undefined4 uVar14;
  ulong unaff_R15;
  size_t mask;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar35;
  float fVar36;
  undefined1 auVar33 [16];
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar64;
  float fVar65;
  undefined1 auVar63 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1048 [4];
  ulong local_1038;
  undefined1 (*local_1030) [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  local_fa8 = (query->p).field_0.field_0.x;
  local_fb8 = (query->p).field_0.field_0.y;
  local_fc8 = (query->p).field_0.field_0.z;
  fVar62 = (context->query_radius).field_0.m128[0];
  fVar64 = (context->query_radius).field_0.m128[1];
  fVar65 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_f98 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_f98 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  local_1030 = (undefined1 (*) [16])local_f68;
  bVar8 = false;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  local_1038 = unaff_R15;
  do {
    local_ff8 = local_fa8 - fVar62;
    fStack_ff4 = fStack_fa4 - fVar62;
    fStack_ff0 = fStack_fa0 - fVar62;
    fStack_fec = fStack_f9c - fVar62;
    local_1008 = local_fa8 + fVar62;
    fStack_1004 = fStack_fa4 + fVar62;
    fStack_1000 = fStack_fa0 + fVar62;
    fStack_ffc = fStack_f9c + fVar62;
    local_1018._0_4_ = local_fb8 - fVar64;
    local_1018._4_4_ = fStack_fb4 - fVar64;
    fStack_1010 = fStack_fb0 - fVar64;
    fStack_100c = fStack_fac - fVar64;
    local_fd8 = fVar64 + local_fb8;
    fStack_fd4 = fVar64 + fStack_fb4;
    fStack_fd0 = fVar64 + fStack_fb0;
    fStack_fcc = fVar64 + fStack_fac;
    local_1028 = local_fc8 - fVar65;
    fStack_1024 = fStack_fc4 - fVar65;
    fStack_1020 = fStack_fc0 - fVar65;
    fStack_101c = fStack_fbc - fVar65;
    local_fe8._0_4_ = fVar65 + local_fc8;
    local_fe8._4_4_ = fVar65 + fStack_fc4;
    fStack_fe0 = fVar65 + fStack_fc0;
    fStack_fdc = fVar65 + fStack_fbc;
    local_f88 = fVar62 * fVar62;
    fStack_f84 = fVar62 * fVar62;
    fStack_f80 = fVar62 * fVar62;
    fStack_f7c = fVar62 * fVar62;
    fVar64 = local_fa8;
    fVar65 = fStack_fa4;
    fVar49 = fStack_fa0;
    fVar50 = fStack_f9c;
    fVar51 = local_fb8;
    fVar52 = fStack_fb4;
    fVar53 = fStack_fb0;
    fVar62 = fStack_fac;
    fVar54 = local_fc8;
    fVar55 = fStack_fc4;
    fVar56 = fStack_fc0;
    fVar57 = fStack_fbc;
    fVar58 = fVar62 * fVar62;
    fVar59 = fVar62 * fVar62;
    fVar60 = fVar62 * fVar62;
    fVar61 = fVar62 * fVar62;
    auVar63 = local_f98;
    do {
      do {
        do {
          if (local_1030 == (undefined1 (*) [16])local_f78) {
            return bVar8;
          }
          pauVar5 = local_1030 + -1;
          local_1030 = local_1030 + -1;
        } while (auVar63._0_4_ < *(float *)(*pauVar5 + 8));
        uVar11 = *(ulong *)*local_1030;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar11 & 8) == 0) {
              auVar24 = *(undefined1 (*) [16])(uVar11 + 0x20);
              auVar28 = *(undefined1 (*) [16])(uVar11 + 0x30);
              auVar26._4_4_ = fVar65;
              auVar26._0_4_ = fVar64;
              auVar26._8_4_ = fVar49;
              auVar26._12_4_ = fVar50;
              auVar26 = maxps(auVar26,auVar24);
              auVar26 = minps(auVar26,auVar28);
              auVar33._4_4_ = fVar52;
              auVar33._0_4_ = fVar51;
              auVar33._8_4_ = fVar53;
              auVar33._12_4_ = fVar62;
              auVar33 = maxps(auVar33,*(undefined1 (*) [16])(uVar11 + 0x40));
              fVar25 = auVar26._0_4_ - fVar64;
              fVar29 = auVar26._4_4_ - fVar65;
              fVar30 = auVar26._8_4_ - fVar49;
              fVar31 = auVar26._12_4_ - fVar50;
              auVar26 = minps(auVar33,*(undefined1 (*) [16])(uVar11 + 0x50));
              auVar44._4_4_ = fVar55;
              auVar44._0_4_ = fVar54;
              auVar44._8_4_ = fVar56;
              auVar44._12_4_ = fVar57;
              auVar33 = maxps(auVar44,*(undefined1 (*) [16])(uVar11 + 0x60));
              auVar33 = minps(auVar33,*(undefined1 (*) [16])(uVar11 + 0x70));
              fVar32 = auVar26._0_4_ - fVar51;
              fVar35 = auVar26._4_4_ - fVar52;
              fVar36 = auVar26._8_4_ - fVar53;
              fVar37 = auVar26._12_4_ - fVar62;
              fVar38 = auVar33._0_4_ - fVar54;
              fVar40 = auVar33._4_4_ - fVar55;
              fVar41 = auVar33._8_4_ - fVar56;
              fVar42 = auVar33._12_4_ - fVar57;
              local_1048[0] = fVar38 * fVar38 + fVar32 * fVar32 + fVar25 * fVar25;
              local_1048[1] = fVar40 * fVar40 + fVar35 * fVar35 + fVar29 * fVar29;
              local_1048[2] = fVar41 * fVar41 + fVar36 * fVar36 + fVar30 * fVar30;
              local_1048[3] = fVar42 * fVar42 + fVar37 * fVar37 + fVar31 * fVar31;
              auVar46._0_4_ = -(uint)(auVar24._0_4_ <= auVar28._0_4_ && local_1048[0] <= fVar58);
              auVar46._4_4_ = -(uint)(auVar24._4_4_ <= auVar28._4_4_ && local_1048[1] <= fVar59);
              auVar46._8_4_ = -(uint)(auVar24._8_4_ <= auVar28._8_4_ && local_1048[2] <= fVar60);
              auVar46._12_4_ = -(uint)(auVar24._12_4_ <= auVar28._12_4_ && local_1048[3] <= fVar61);
LAB_00e8a2d8:
              uVar14 = movmskps((int)local_1038,auVar46);
              local_1038 = CONCAT44((int)(local_1038 >> 0x20),uVar14);
            }
          }
          else if ((uVar11 & 8) == 0) {
            auVar24 = *(undefined1 (*) [16])(uVar11 + 0x60);
            auVar28 = *(undefined1 (*) [16])(uVar11 + 0x20);
            auVar26 = *(undefined1 (*) [16])(uVar11 + 0x30);
            auVar33 = *(undefined1 (*) [16])(uVar11 + 0x40);
            auVar44 = *(undefined1 (*) [16])(uVar11 + 0x50);
            auVar16 = *(undefined1 (*) [16])(uVar11 + 0x70);
            auVar45._4_4_ = fVar65;
            auVar45._0_4_ = fVar64;
            auVar45._8_4_ = fVar49;
            auVar45._12_4_ = fVar50;
            auVar46 = maxps(auVar45,auVar28);
            auVar46 = minps(auVar46,auVar26);
            fVar25 = auVar46._0_4_ - fVar64;
            fVar30 = auVar46._4_4_ - fVar65;
            fVar32 = auVar46._8_4_ - fVar49;
            fVar36 = auVar46._12_4_ - fVar50;
            auVar48._4_4_ = fVar52;
            auVar48._0_4_ = fVar51;
            auVar48._8_4_ = fVar53;
            auVar48._12_4_ = fVar62;
            auVar46 = maxps(auVar48,auVar33);
            auVar46 = minps(auVar46,auVar44);
            fVar38 = auVar46._0_4_ - fVar51;
            fVar40 = auVar46._4_4_ - fVar52;
            fVar41 = auVar46._8_4_ - fVar53;
            fVar42 = auVar46._12_4_ - fVar62;
            auVar47._4_4_ = fVar55;
            auVar47._0_4_ = fVar54;
            auVar47._8_4_ = fVar56;
            auVar47._12_4_ = fVar57;
            auVar46 = maxps(auVar47,auVar24);
            auVar46 = minps(auVar46,auVar16);
            fVar29 = auVar46._0_4_ - fVar54;
            fVar31 = auVar46._4_4_ - fVar55;
            fVar35 = auVar46._8_4_ - fVar56;
            fVar37 = auVar46._12_4_ - fVar57;
            local_1048[0] = fVar29 * fVar29 + fVar38 * fVar38 + fVar25 * fVar25;
            local_1048[1] = fVar31 * fVar31 + fVar40 * fVar40 + fVar30 * fVar30;
            local_1048[2] = fVar35 * fVar35 + fVar41 * fVar41 + fVar32 * fVar32;
            local_1048[3] = fVar37 * fVar37 + fVar42 * fVar42 + fVar36 * fVar36;
            auVar46._0_4_ =
                 (uint)(((auVar24._0_4_ <= (float)local_fe8._0_4_ && local_ff8 <= auVar26._0_4_) &&
                        (auVar33._0_4_ <= local_fd8 && auVar28._0_4_ <= local_1008)) &&
                       (local_1028 <= auVar16._0_4_ &&
                       ((float)local_1018._0_4_ <= auVar44._0_4_ && auVar28._0_4_ <= auVar26._0_4_))
                       ) * -0x80000000;
            auVar46._4_4_ =
                 (uint)(((auVar24._4_4_ <= (float)local_fe8._4_4_ && fStack_ff4 <= auVar26._4_4_) &&
                        (auVar33._4_4_ <= fStack_fd4 && auVar28._4_4_ <= fStack_1004)) &&
                       (fStack_1024 <= auVar16._4_4_ &&
                       ((float)local_1018._4_4_ <= auVar44._4_4_ && auVar28._4_4_ <= auVar26._4_4_))
                       ) * -0x80000000;
            auVar46._8_4_ =
                 (uint)(((auVar24._8_4_ <= fStack_fe0 && fStack_ff0 <= auVar26._8_4_) &&
                        (auVar33._8_4_ <= fStack_fd0 && auVar28._8_4_ <= fStack_1000)) &&
                       (fStack_1020 <= auVar16._8_4_ &&
                       (fStack_1010 <= auVar44._8_4_ && auVar28._8_4_ <= auVar26._8_4_))) *
                 -0x80000000;
            auVar46._12_4_ =
                 (uint)(((auVar24._12_4_ <= fStack_fdc && fStack_fec <= auVar26._12_4_) &&
                        (auVar33._12_4_ <= fStack_fcc && auVar28._12_4_ <= fStack_ffc)) &&
                       (fStack_101c <= auVar16._12_4_ &&
                       (fStack_100c <= auVar44._12_4_ && auVar28._12_4_ <= auVar26._12_4_))) *
                 -0x80000000;
            goto LAB_00e8a2d8;
          }
          if ((uVar11 & 8) == 0) {
            if (local_1038 == 0) {
              iVar9 = 4;
            }
            else {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              lVar15 = 0;
              if (local_1038 != 0) {
                for (; (local_1038 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              iVar9 = 0;
              uVar11 = *(ulong *)(uVar10 + lVar15 * 8);
              uVar12 = local_1038 - 1 & local_1038;
              if (uVar12 != 0) {
                fVar25 = local_1048[lVar15];
                lVar15 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar3 = *(ulong *)(uVar10 + lVar15 * 8);
                fVar29 = local_1048[lVar15];
                uVar12 = uVar12 - 1 & uVar12;
                if (uVar12 == 0) {
                  if ((uint)fVar25 < (uint)fVar29) {
                    *(ulong *)*local_1030 = uVar3;
                    *(float *)(*local_1030 + 8) = fVar29;
                    local_1030 = local_1030 + 1;
                  }
                  else {
                    *(ulong *)*local_1030 = uVar11;
                    *(float *)(*local_1030 + 8) = fVar25;
                    local_1030 = local_1030 + 1;
                    uVar11 = uVar3;
                  }
                }
                else {
                  auVar24._8_4_ = fVar25;
                  auVar24._0_8_ = uVar11;
                  auVar24._12_4_ = 0;
                  auVar28._8_4_ = fVar29;
                  auVar28._0_8_ = uVar3;
                  auVar28._12_4_ = 0;
                  lVar15 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  uVar4 = *(undefined8 *)(uVar10 + lVar15 * 8);
                  fVar30 = local_1048[lVar15];
                  auVar27._8_4_ = fVar30;
                  auVar27._0_8_ = uVar4;
                  auVar27._12_4_ = 0;
                  auVar16._8_4_ = -(uint)((int)fVar25 < (int)fVar29);
                  uVar12 = uVar12 - 1 & uVar12;
                  if (uVar12 == 0) {
                    auVar16._4_4_ = auVar16._8_4_;
                    auVar16._0_4_ = auVar16._8_4_;
                    auVar16._12_4_ = auVar16._8_4_;
                    auVar34._8_4_ = fVar29;
                    auVar34._0_8_ = uVar3;
                    auVar34._12_4_ = 0;
                    auVar26 = blendvps(auVar34,auVar24,auVar16);
                    auVar24 = blendvps(auVar24,auVar28,auVar16);
                    auVar17._8_4_ = -(uint)(auVar26._8_4_ < (int)fVar30);
                    auVar17._4_4_ = auVar17._8_4_;
                    auVar17._0_4_ = auVar17._8_4_;
                    auVar17._12_4_ = auVar17._8_4_;
                    auVar39._8_4_ = fVar30;
                    auVar39._0_8_ = uVar4;
                    auVar39._12_4_ = 0;
                    auVar33 = blendvps(auVar39,auVar26,auVar17);
                    auVar26 = blendvps(auVar26,auVar27,auVar17);
                    auVar18._8_4_ = -(uint)(auVar24._8_4_ < auVar26._8_4_);
                    auVar18._4_4_ = auVar18._8_4_;
                    auVar18._0_4_ = auVar18._8_4_;
                    auVar18._12_4_ = auVar18._8_4_;
                    auVar28 = blendvps(auVar26,auVar24,auVar18);
                    auVar24 = blendvps(auVar24,auVar26,auVar18);
                    *local_1030 = auVar24;
                    local_1030[1] = auVar28;
                    local_1030 = local_1030 + 2;
                    uVar11 = auVar33._0_8_;
                  }
                  else {
                    lVar15 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                      }
                    }
                    auVar19._4_4_ = auVar16._8_4_;
                    auVar19._0_4_ = auVar16._8_4_;
                    auVar19._8_4_ = auVar16._8_4_;
                    auVar19._12_4_ = auVar16._8_4_;
                    auVar26 = blendvps(auVar28,auVar24,auVar19);
                    auVar24 = blendvps(auVar24,auVar28,auVar19);
                    auVar43._8_4_ = local_1048[lVar15];
                    auVar43._0_8_ = *(undefined8 *)(uVar10 + lVar15 * 8);
                    auVar43._12_4_ = 0;
                    auVar20._8_4_ = -(uint)((int)fVar30 < (int)local_1048[lVar15]);
                    auVar20._4_4_ = auVar20._8_4_;
                    auVar20._0_4_ = auVar20._8_4_;
                    auVar20._12_4_ = auVar20._8_4_;
                    auVar33 = blendvps(auVar43,auVar27,auVar20);
                    auVar28 = blendvps(auVar27,auVar43,auVar20);
                    auVar21._8_4_ = -(uint)(auVar24._8_4_ < auVar28._8_4_);
                    auVar21._4_4_ = auVar21._8_4_;
                    auVar21._0_4_ = auVar21._8_4_;
                    auVar21._12_4_ = auVar21._8_4_;
                    auVar44 = blendvps(auVar28,auVar24,auVar21);
                    auVar24 = blendvps(auVar24,auVar28,auVar21);
                    auVar22._8_4_ = -(uint)(auVar26._8_4_ < auVar33._8_4_);
                    auVar22._4_4_ = auVar22._8_4_;
                    auVar22._0_4_ = auVar22._8_4_;
                    auVar22._12_4_ = auVar22._8_4_;
                    auVar28 = blendvps(auVar33,auVar26,auVar22);
                    auVar26 = blendvps(auVar26,auVar33,auVar22);
                    auVar23._8_4_ = -(uint)(auVar26._8_4_ < auVar44._8_4_);
                    auVar23._4_4_ = auVar23._8_4_;
                    auVar23._0_4_ = auVar23._8_4_;
                    auVar23._12_4_ = auVar23._8_4_;
                    auVar33 = blendvps(auVar44,auVar26,auVar23);
                    auVar26 = blendvps(auVar26,auVar44,auVar23);
                    *local_1030 = auVar24;
                    local_1030[1] = auVar26;
                    local_1030[2] = auVar33;
                    local_1030 = local_1030 + 3;
                    uVar11 = auVar28._0_8_;
                    iVar9 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar9 = 6;
          }
        } while (iVar9 == 0);
      } while ((iVar9 != 6) || (uVar10 = (ulong)((uint)uVar11 & 0xf), uVar10 == 8));
      lVar15 = 0;
      bVar6 = 0;
      do {
        bVar13 = bVar6;
        uVar2 = *(uint *)((uVar11 & 0xfffffffffffffff0) + lVar15 * 8);
        this = (context->scene->geometries).items[uVar2].ptr;
        context->geomID = uVar2;
        context->primID = *(uint *)((uVar11 & 0xfffffffffffffff0) + 4 + lVar15 * 8);
        bVar7 = Geometry::pointQuery(this,query,context);
        lVar15 = lVar15 + 1;
        bVar6 = bVar13 | bVar7;
      } while (uVar10 - 8 != lVar15);
      fVar64 = local_fa8;
      fVar65 = fStack_fa4;
      fVar49 = fStack_fa0;
      fVar50 = fStack_f9c;
      fVar51 = local_fb8;
      fVar52 = fStack_fb4;
      fVar53 = fStack_fb0;
      fVar62 = fStack_fac;
      fVar54 = local_fc8;
      fVar55 = fStack_fc4;
      fVar56 = fStack_fc0;
      fVar57 = fStack_fbc;
      fVar58 = local_f88;
      fVar59 = fStack_f84;
      fVar60 = fStack_f80;
      fVar61 = fStack_f7c;
      auVar63 = local_f98;
    } while (bVar13 == 0 && !bVar7);
    auVar63 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar62 = auVar63._0_4_;
    fVar64 = auVar63._4_4_;
    fVar65 = auVar63._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_f98 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_f98 = dpps(auVar63,auVar63,0x7f);
    }
    bVar8 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }